

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

bool dxil_spv::get_texel_offsets
               (Impl *impl,CallInst *instruction,uint32_t *image_flags,uint base_operand,
               uint num_coords,Id *offsets,bool instruction_is_gather)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Id IVar4;
  Builder *this;
  Value *pVVar5;
  Constant *pCVar6;
  APInt *pAVar7;
  int64_t iVar8;
  Operation *op;
  Operation *cast_op;
  ConstantInt *constant_arg_1;
  Value *operand;
  uint i_1;
  ConstantInt *constant_arg;
  uint i;
  bool has_non_zero_offset;
  bool is_const_offset;
  Builder *builder;
  bool instruction_is_gather_local;
  Id *offsets_local;
  uint num_coords_local;
  uint base_operand_local;
  uint32_t *image_flags_local;
  CallInst *instruction_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  bVar1 = true;
  bVar3 = false;
  constant_arg._0_4_ = 0;
  do {
    if (num_coords <= (uint)constant_arg) {
LAB_0020f296:
      if (bVar3) {
        if (bVar1) {
          *image_flags = *image_flags | 8;
        }
        else {
          *image_flags = *image_flags | 0x10;
        }
        for (operand._4_4_ = 0; operand._4_4_ < num_coords; operand._4_4_ = operand._4_4_ + 1) {
          pVVar5 = LLVMBC::Instruction::getOperand
                             (&instruction->super_Instruction,base_operand + operand._4_4_);
          bVar3 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar5);
          if (bVar3) {
            IVar4 = spv::Builder::makeIntConstant(this,0,false);
            offsets[operand._4_4_] = IVar4;
          }
          else {
            pVVar5 = LLVMBC::Instruction::getOperand
                               (&instruction->super_Instruction,base_operand + operand._4_4_);
            if (bVar1) {
              pCVar6 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar5)->super_Constant;
              pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
              iVar8 = LLVMBC::APInt::getSExtValue(pAVar7);
              IVar4 = spv::Builder::makeIntConstant(this,(int)iVar8,false);
              offsets[operand._4_4_] = IVar4;
            }
            else {
              IVar4 = spv::Builder::makeIntegerType(this,0x20,true);
              op = Converter::Impl::allocate(impl,OpBitcast,IVar4);
              Converter::Impl::add(impl,op,false);
              IVar4 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
              Operation::add_id(op,IVar4);
              offsets[operand._4_4_] = op->id;
            }
          }
        }
      }
      return true;
    }
    pVVar5 = LLVMBC::Instruction::getOperand
                       (&instruction->super_Instruction,base_operand + (uint)constant_arg);
    bVar2 = LLVMBC::isa<LLVMBC::UndefValue>(pVVar5);
    if (!bVar2) {
      pVVar5 = LLVMBC::Instruction::getOperand
                         (&instruction->super_Instruction,base_operand + (uint)constant_arg);
      pCVar6 = &LLVMBC::dyn_cast<LLVMBC::ConstantInt>(pVVar5)->super_Constant;
      if (pCVar6 == (Constant *)0x0) {
        spv::Builder::addCapability(this,CapabilityImageGatherExtended);
        bVar1 = false;
        bVar3 = true;
        goto LAB_0020f296;
      }
      pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
      iVar8 = LLVMBC::APInt::getSExtValue(pAVar7);
      if (iVar8 != 0) {
        bVar3 = true;
      }
    }
    constant_arg._0_4_ = (uint)constant_arg + 1;
  } while( true );
}

Assistant:

static bool get_texel_offsets(Converter::Impl &impl, const llvm::CallInst *instruction, uint32_t &image_flags,
                              unsigned base_operand, unsigned num_coords, spv::Id *offsets,
                              bool instruction_is_gather)
{
	auto &builder = impl.builder();

	bool is_const_offset = true;
	bool has_non_zero_offset = false;

	for (unsigned i = 0; i < num_coords; i++)
	{
		// Treat undefined offset as 0, since we can.
		if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(base_operand + i)))
		{
			auto *constant_arg = llvm::dyn_cast<llvm::ConstantInt>(instruction->getOperand(base_operand + i));
			if (constant_arg)
			{
				if (constant_arg->getUniqueInteger().getSExtValue() != 0)
					has_non_zero_offset = true;
			}
			else
			{
				builder.addCapability(spv::CapabilityImageGatherExtended);
				is_const_offset = false;
				has_non_zero_offset = true;
				break;
			}
		}
	}

	// Don't bother emitting offset if they are all 0.
	if (!has_non_zero_offset)
		return true;

	if (is_const_offset)
		image_flags |= spv::ImageOperandsConstOffsetMask;
	else
		image_flags |= spv::ImageOperandsOffsetMask;

	for (unsigned i = 0; i < num_coords; i++)
	{
		if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(base_operand + i)))
		{
			auto operand = instruction->getOperand(base_operand + i);
			if (is_const_offset)
			{
				auto *constant_arg = llvm::dyn_cast<llvm::ConstantInt>(operand);
				offsets[i] = builder.makeIntConstant(int(constant_arg->getUniqueInteger().getSExtValue()));
			}
			else
			{
				// Makes sure when we build the array, it's the correct element type.
				auto *cast_op = impl.allocate(spv::OpBitcast, builder.makeIntegerType(32, true));
				impl.add(cast_op);
				cast_op->add_id(impl.get_id_for_value(operand));
				offsets[i] = cast_op->id;
			}
		}
		else
			offsets[i] = builder.makeIntConstant(0);
	}

	return true;
}